

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClassSpecificMergeFrom
          (MessageGenerator *this,Printer *printer)

{
  FieldGeneratorMap *this_00;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields;
  pointer *pppFVar1;
  Descriptor *pDVar2;
  pointer ppFVar3;
  FieldDescriptor *pFVar4;
  iterator __position;
  pointer piVar5;
  long lVar6;
  pointer pcVar7;
  MessageGenerator *this_01;
  pointer pvVar8;
  bool bVar9;
  FileOptions_OptimizeMode FVar10;
  int iVar11;
  int iVar12;
  uint32_t uVar13;
  LogMessage *pLVar14;
  long *plVar15;
  ulong uVar16;
  FieldGenerator *pFVar17;
  long lVar18;
  uint32_t uVar19;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX_01;
  ulong uVar20;
  char *pcVar21;
  FieldDescriptor FVar22;
  const_iterator __end4;
  const_iterator __begin4;
  pointer ppFVar23;
  byte bVar24;
  iterator __position_00;
  byte bVar25;
  _Base_ptr this_02;
  int iVar26;
  Options *pOVar27;
  undefined4 uVar28;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 uVar29;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  Hex hex;
  Hex hex_00;
  int cached_has_word_index;
  string chunk_mask_str;
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  chunks;
  Formatter format;
  Iterator __begin4_1;
  Iterator __end3;
  Iterator __end4_1;
  ColdChunkSkipper cold_skipper;
  int local_1ac;
  MessageGenerator *local_1a8;
  undefined4 local_19c;
  Printer *local_198;
  Options *local_190;
  undefined1 local_188 [16];
  undefined1 local_178 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  uint local_12c;
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  local_128;
  _Base_ptr local_110;
  Formatter local_108;
  int local_cc;
  vector<int,_std::allocator<int>_> *local_c8;
  ulong local_c0;
  Iterator local_b8;
  Iterator local_a8;
  Iterator local_98;
  ColdChunkSkipper local_88;
  
  pDVar2 = this->descriptor_;
  local_1a8 = this;
  local_198 = printer;
  FVar10 = GetOptimizeFor(*(FileDescriptor **)(pDVar2 + 0x10),&this->options_,(bool *)0x0);
  if (((FVar10 == FileOptions_OptimizeMode_LITE_RUNTIME) || (*(int *)(pDVar2 + 0x78) != 0)) ||
     (*(int *)(pDVar2 + 4) != 0)) {
    local_108.printer_ = local_198;
    local_190 = &this->options_;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&local_108.vars_._M_t,&(local_1a8->variables_)._M_t);
    Formatter::operator()<>
              (&local_108,
               "void $classname$::MergeFrom(const $classname$& from) {\n$annotate_mergefrom$// @@protoc_insertion_point(class_specific_merge_from_start:$full_name$)\n  $DCHK$_NE(&from, this);\n"
              );
    io::Printer::Indent(local_108.printer_);
    Formatter::operator()<>(&local_108,"$uint32$ cached_has_bits = 0;\n(void) cached_has_bits;\n\n")
    ;
    this_01 = local_1a8;
    ppFVar23 = (local_1a8->optimized_order_).
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppFVar3 = (local_1a8->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    uVar28 = 0;
    uVar29 = 0;
    local_128.
    super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *)0x0;
    local_128.
    super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *)0x0;
    local_128.
    super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __position_00._M_current =
         local_128.
         super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    for (; local_128.
           super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish = __position_00._M_current,
        ppFVar23 != ppFVar3; ppFVar23 = ppFVar23 + 1) {
      pFVar4 = *ppFVar23;
      local_88.chunks_ =
           (vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
            *)pFVar4;
      if (local_128.
          super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start == __position_00._M_current) {
LAB_002a7ae6:
        if (__position_00._M_current ==
            local_128.
            super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
          ::_M_realloc_insert<>(&local_128,__position_00);
          __position_00._M_current =
               local_128.
               super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          uVar28 = extraout_XMM0_Da_00;
          uVar29 = extraout_XMM0_Db_00;
        }
        else {
          uVar28 = 0;
          uVar29 = 0;
          ((__position_00._M_current)->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          ((__position_00._M_current)->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          ((__position_00._M_current)->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_128.
          super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_128.
               super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
          __position_00._M_current =
               local_128.
               super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      else {
        iVar11 = HasBitIndex(this_01,__position_00._M_current[-1].
                                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish[-1]);
        iVar26 = iVar11 + 7;
        if (-1 < iVar11) {
          iVar26 = iVar11;
        }
        iVar26 = iVar26 >> 3;
        if (iVar11 == -1) {
          iVar26 = -1;
        }
        iVar12 = HasBitIndex(this_01,pFVar4);
        iVar11 = iVar12 + 7;
        if (-1 < iVar12) {
          iVar11 = iVar12;
        }
        iVar11 = iVar11 >> 3;
        if (iVar12 == -1) {
          iVar11 = -1;
        }
        uVar28 = extraout_XMM0_Da;
        uVar29 = extraout_XMM0_Db;
        if (iVar26 != iVar11) goto LAB_002a7ae6;
      }
      __position._M_current =
           __position_00._M_current[-1].
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          __position_00._M_current[-1].
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
        ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                  ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)(__position_00._M_current + -1),__position,(FieldDescriptor **)&local_88);
        uVar28 = extraout_XMM0_Da_01;
        uVar29 = extraout_XMM0_Db_01;
      }
      else {
        *__position._M_current = (FieldDescriptor *)local_88.chunks_;
        pppFVar1 = &__position_00._M_current[-1].
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppFVar1 = *pppFVar1 + 1;
      }
      __position_00._M_current =
           local_128.
           super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    }
    local_c8 = &local_1a8->has_bit_indices_;
    anon_unknown_0::ColdChunkSkipper::ColdChunkSkipper
              (&local_88,local_190,&local_128,local_c8,(double)CONCAT44(uVar29,uVar28));
    local_1ac = -1;
    if (local_128.
        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_128.
        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      this_02 = (_Base_ptr)&local_1a8->field_generators_;
      uVar20 = 0;
      local_110 = this_02;
      do {
        pvVar8 = local_128.
                 super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar7 = local_178 + 0x38;
        ppFVar23 = local_128.
                   super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar20].
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        local_c0 = uVar20;
        if ((ulong)((long)local_128.
                          super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar20].
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar23) < 9) {
          local_19c = 0;
        }
        else {
          iVar26 = HasBitIndex(local_1a8,*ppFVar23);
          local_19c = CONCAT31((int3)(iVar26 + 7U >> 8),iVar26 + 7U < 0xfffffff8 && iVar26 != -1);
        }
        local_150._M_dataplus._M_p = pcVar7;
        std::__cxx11::string::_M_construct<char_const*>((string *)(local_178 + 0x28),"from.","");
        local_188._0_8_ = local_198;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(local_188 + 8),&local_88.variables_._M_t);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)(local_188 + 8));
        if (local_150._M_dataplus._M_p != pcVar7) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        fields = pvVar8 + uVar20;
        if ((char)local_19c == '\0') {
          pOVar27 = (Options *)
                    (fields->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          local_190 = (Options *)
                      (fields->
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          if (pOVar27 != local_190) goto LAB_002a7e3d;
        }
        else {
          uVar13 = anon_unknown_0::GenChunkMask(fields,local_c8);
          hex.value = (ulong)uVar13;
          hex._8_8_ = 8;
          strings::AlphaNum::AlphaNum((AlphaNum *)local_188,hex);
          local_150._M_dataplus._M_p = pcVar7;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_178 + 0x28),local_188._0_8_,
                     (char *)(local_188._8_8_ + local_188._0_8_));
          if (uVar13 == 0) {
LAB_002a7ce3:
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_188,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0xe21);
            pLVar14 = internal::LogMessage::operator<<
                                ((LogMessage *)local_188,
                                 "CHECK failed: (2) <= (popcnt(chunk_mask)): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_a8,pLVar14);
            internal::LogMessage::~LogMessage((LogMessage *)local_188);
          }
          else {
            iVar26 = 0;
            uVar19 = uVar13;
            do {
              iVar26 = iVar26 + (uVar19 & 1);
              bVar9 = 1 < uVar19;
              uVar19 = uVar19 >> 1;
            } while (bVar9);
            if (iVar26 < 2) goto LAB_002a7ce3;
          }
          if (uVar13 != 0) {
            iVar26 = 0;
            do {
              iVar26 = iVar26 + (uVar13 & 1);
              bVar9 = 1 < uVar13;
              uVar13 = uVar13 >> 1;
            } while (bVar9);
            if (8 < iVar26) {
              internal::LogMessage::LogMessage
                        ((LogMessage *)local_188,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                         ,0xe22);
              pLVar14 = internal::LogMessage::operator<<
                                  ((LogMessage *)local_188,
                                   "CHECK failed: (8) >= (popcnt(chunk_mask)): ");
              internal::LogFinisher::operator=((LogFinisher *)&local_a8,pLVar14);
              internal::LogMessage::~LogMessage((LogMessage *)local_188);
            }
          }
          iVar11 = local_1ac;
          iVar12 = HasBitIndex(local_1a8,
                               *(fields->
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                )._M_impl.super__Vector_impl_data._M_start);
          iVar26 = iVar12 + 0x1f;
          if (-1 < iVar12) {
            iVar26 = iVar12;
          }
          iVar26 = iVar26 >> 5;
          if (iVar12 == -1) {
            iVar26 = -1;
          }
          if (iVar11 != iVar26) {
            local_1ac = iVar26;
            Formatter::operator()(&local_108,"cached_has_bits = from._has_bits_[$1$];\n",&local_1ac)
            ;
          }
          Formatter::operator()
                    (&local_108,"if (cached_has_bits & 0x$1$u) {\n",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_178 + 0x28));
          io::Printer::Indent(local_108.printer_);
          if (local_150._M_dataplus._M_p != pcVar7) {
            operator_delete(local_150._M_dataplus._M_p);
          }
          pOVar27 = (Options *)
                    (fields->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          local_190 = (Options *)
                      (fields->
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          if (pOVar27 == local_190) {
            if ((char)local_19c == '\0') goto LAB_002a8306;
          }
          else {
LAB_002a7e3d:
            local_12c = 0;
            do {
              pFVar4 = (FieldDescriptor *)(pOVar27->dllexport_decl)._M_dataplus._M_p;
              pFVar17 = FieldGeneratorMap::get((FieldGeneratorMap *)this_02,pFVar4);
              FVar22 = pFVar4[1];
              bVar24 = (byte)FVar22 & 0x60;
              if (bVar24 == 0x60) {
                (*pFVar17->_vptr_FieldGenerator[0xc])(pFVar17,local_198);
              }
              else {
                if (bVar24 == 0x20) {
                  if (((((byte)FVar22 & 2) == 0) &&
                      ((*(char *)(*(long *)(pFVar4 + 0x10) + 0x3a) != '\x02' ||
                       ((((byte)FVar22 & 0x10) != 0 && (*(long *)(pFVar4 + 0x28) != 0)))))) ||
                     (bVar25 = *(byte *)(*(long *)(pFVar4 + 0x38) + 0x4f), bVar25 == 1)) {
                    local_188._0_8_ = local_178;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"from.","");
                    bVar9 = anon_unknown_0::EmitFieldNonDefaultCondition
                                      (local_198,(string *)local_188,pFVar4);
                    this_02 = local_110;
                    if ((Printer *)local_188._0_8_ != (Printer *)local_178) {
                      operator_delete((void *)local_188._0_8_);
                    }
                    (*pFVar17->_vptr_FieldGenerator[0xc])(pFVar17,local_198);
                    if (bVar9) {
                      io::Printer::Outdent(local_108.printer_);
                      Formatter::operator()<>(&local_108,"}\n");
                    }
                    goto LAB_002a812b;
                  }
                }
                else {
                  bVar25 = *(byte *)(*(long *)(pFVar4 + 0x38) + 0x4f);
                }
                if ((bVar25 & 1) == 0) {
                  local_cc = local_1ac;
                  iVar11 = HasBitIndex(local_1a8,pFVar4);
                  this_02 = local_110;
                  iVar26 = iVar11 + 0x1f;
                  if (-1 < iVar11) {
                    iVar26 = iVar11;
                  }
                  iVar26 = iVar26 >> 5;
                  if (iVar11 == -1) {
                    iVar26 = -1;
                  }
                  if (local_cc == iVar26) {
                    if (((byte)FVar22 & 2) == 0) {
                      if ((bVar24 == 0x20) && (*(char *)(*(long *)(pFVar4 + 0x10) + 0x3a) == '\x02')
                         ) {
                        if ((((byte)FVar22 & 0x10) != 0) && (*(long *)(pFVar4 + 0x28) != 0)) {
LAB_002a7fd6:
                          internal::LogMessage::LogMessage
                                    ((LogMessage *)local_188,LOGLEVEL_DFATAL,
                                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                                     ,0xe4a);
                          pLVar14 = internal::LogMessage::operator<<
                                              ((LogMessage *)local_188,
                                               "CHECK failed: HasHasbit(field): ");
                          internal::LogFinisher::operator=
                                    ((LogFinisher *)(local_178 + 0x28),pLVar14);
                          internal::LogMessage::~LogMessage((LogMessage *)local_188);
                          FVar22 = pFVar4[1];
                        }
                      }
                      else if (bVar24 != 0x40) goto LAB_002a7fd6;
                    }
                    if (((byte)FVar22 & 8) == 0) {
                      plVar15 = (long *)(*(long *)(pFVar4 + 0x20) + 0x28);
                    }
                    else if (*(long *)(pFVar4 + 0x28) == 0) {
                      plVar15 = (long *)(*(long *)(pFVar4 + 0x10) + 0x70);
                    }
                    else {
                      plVar15 = (long *)(*(long *)(pFVar4 + 0x28) + 0x50);
                    }
                    piVar5 = (local_c8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start;
                    uVar20 = CONCAT71((int7)((ulong)piVar5 >> 8),
                                      (char)piVar5[(int)((ulong)((long)pFVar4 - *plVar15) >> 3) *
                                                   0x38e38e39]) & 0xffffffffffffff1f;
                    hex_00.value = 1L << (sbyte)uVar20;
                    hex_00._8_8_ = 8;
                    strings::AlphaNum::AlphaNum((AlphaNum *)local_188,hex_00);
                    local_150._M_dataplus._M_p = local_178 + 0x38;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)(local_178 + 0x28),local_188._0_8_,
                               (char *)(local_188._8_8_ + local_188._0_8_));
                    Formatter::operator()
                              (&local_108,"if (cached_has_bits & 0x$1$u) {\n",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_178 + 0x28));
                    io::Printer::Indent(local_108.printer_);
                    if (((char)local_19c == '\0') || (bVar9 = anon_unknown_0::IsPOD(pFVar4), !bVar9)
                       ) {
                      (*pFVar17->_vptr_FieldGenerator[0xc])(pFVar17,local_198);
                    }
                    else {
                      local_12c = (uint)CONCAT71((int7)(uVar20 >> 8),1);
                      (*pFVar17->_vptr_FieldGenerator[0xd])(pFVar17,local_198);
                    }
                    io::Printer::Outdent(local_108.printer_);
                    Formatter::operator()<>(&local_108,"}\n");
                    if (local_150._M_dataplus._M_p != local_178 + 0x38) {
                      operator_delete(local_150._M_dataplus._M_p);
                    }
                    goto LAB_002a812b;
                  }
                  field = extraout_RDX_00;
                  if (((byte)FVar22 & 2) == 0) goto LAB_002a802d;
                }
                else {
                  field = extraout_RDX;
                  if (((byte)FVar22 & 2) == 0) {
LAB_002a802d:
                    if ((bVar24 == 0x20) && (*(char *)(*(long *)(pFVar4 + 0x10) + 0x3a) == '\x02'))
                    {
                      if (((byte)FVar22 >> 4 & *(long *)(pFVar4 + 0x28) != 0) == 0) {
LAB_002a8054:
                        this_02 = local_110;
                        if ((bVar25 & 1) == 0) goto LAB_002a80b8;
                      }
                    }
                    else if (bVar24 == 0x40) goto LAB_002a8054;
                  }
                  internal::LogMessage::LogMessage
                            ((LogMessage *)local_188,LOGLEVEL_DFATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                             ,0xe42);
                  pLVar14 = internal::LogMessage::operator<<
                                      ((LogMessage *)local_188,"CHECK failed: HasHasbit(field): ");
                  internal::LogFinisher::operator=((LogFinisher *)(local_178 + 0x28),pLVar14);
                  this_02 = local_110;
                  internal::LogMessage::~LogMessage((LogMessage *)local_188);
                  field = extraout_RDX_01;
                }
LAB_002a80b8:
                FieldName_abi_cxx11_((string *)local_188,(cpp *)pFVar4,field);
                Formatter::operator()
                          (&local_108,"if (from._internal_has_$1$()) {\n",(string *)local_188);
                if ((Printer *)local_188._0_8_ != (Printer *)local_178) {
                  operator_delete((void *)local_188._0_8_);
                }
                io::Printer::Indent(local_108.printer_);
                (*pFVar17->_vptr_FieldGenerator[0xc])(pFVar17,local_198);
                io::Printer::Outdent(local_108.printer_);
                Formatter::operator()<>(&local_108,"}\n");
              }
LAB_002a812b:
              pOVar27 = (Options *)&(pOVar27->dllexport_decl)._M_string_length;
            } while (pOVar27 != local_190);
            if ((char)local_19c == '\0') goto LAB_002a8306;
            if ((local_12c & 1) != 0) {
              if (local_1ac < 0) {
                internal::LogMessage::LogMessage
                          ((LogMessage *)local_188,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                           ,0xe62);
                pLVar14 = internal::LogMessage::operator<<
                                    ((LogMessage *)local_188,
                                     "CHECK failed: (0) <= (cached_has_word_index): ");
                internal::LogFinisher::operator=((LogFinisher *)(local_178 + 0x28),pLVar14);
                internal::LogMessage::~LogMessage((LogMessage *)local_188);
              }
              Formatter::operator()(&local_108,"_has_bits_[$1$] |= cached_has_bits;\n",&local_1ac);
            }
          }
          io::Printer::Outdent(local_108.printer_);
          Formatter::operator()<>(&local_108,"}\n");
        }
LAB_002a8306:
        bVar9 = anon_unknown_0::ColdChunkSkipper::OnEndChunk(&local_88,(int)local_c0,local_198);
        if (bVar9) {
          local_1ac = -1;
        }
        uVar20 = local_c0 + 1;
        uVar16 = ((long)local_128.
                        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_128.
                        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      } while (uVar20 <= uVar16 && uVar16 - uVar20 != 0);
    }
    local_150._M_string_length = (size_type)local_1a8->descriptor_;
    local_150._M_dataplus._M_p = local_150._M_dataplus._M_p & 0xffffffff00000000;
    local_a8.idx = *(int *)(local_150._M_string_length + 0x6c);
    this_00 = &local_1a8->field_generators_;
    local_a8.descriptor = (Descriptor *)local_150._M_string_length;
    while (bVar9 = operator==((Iterator *)(local_178 + 0x28),&local_a8), !bVar9) {
      lVar18 = (long)(int)local_150._M_dataplus._M_p;
      lVar6 = *(long *)(local_150._M_string_length + 0x30);
      Formatter::operator()
                (&local_108,"switch (from.$1$_case()) {\n",
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (lVar6 + 8 + lVar18 * 0x28));
      io::Printer::Indent(local_108.printer_);
      local_190 = (Options *)(lVar6 + lVar18 * 0x28);
      local_b8.idx = 0;
      local_98.idx = *(int *)((long)&(local_190->dllexport_decl)._M_dataplus._M_p + 4);
      local_b8.descriptor = (OneofDescriptor *)local_190;
      local_98.descriptor = (OneofDescriptor *)local_190;
      while (bVar9 = operator==(&local_b8,&local_98), !bVar9) {
        lVar18 = (long)local_b8.idx;
        lVar6 = *(long *)((long)local_b8.descriptor + 0x20);
        UnderscoresToCamelCase((string *)local_188,*(string **)(lVar6 + lVar18 * 0x48 + 8),true);
        Formatter::operator()(&local_108,"case k$1$: {\n",(string *)local_188);
        if ((Printer *)local_188._0_8_ != (Printer *)local_178) {
          operator_delete((void *)local_188._0_8_);
        }
        io::Printer::Indent(local_108.printer_);
        pFVar17 = FieldGeneratorMap::get(this_00,(FieldDescriptor *)(lVar6 + lVar18 * 0x48));
        (*pFVar17->_vptr_FieldGenerator[0xc])(pFVar17,local_198);
        Formatter::operator()<>(&local_108,"break;\n");
        io::Printer::Outdent(local_108.printer_);
        Formatter::operator()<>(&local_108,"}\n");
        local_b8.idx = local_b8.idx + 1;
      }
      plVar15 = (long *)(local_190->dllexport_decl)._M_string_length;
      local_188._0_8_ = local_178;
      lVar6 = *plVar15;
      std::__cxx11::string::_M_construct<char*>((string *)local_188,lVar6,plVar15[1] + lVar6);
      if ((char *)local_188._8_8_ != (char *)0x0) {
        pcVar21 = (char *)0x0;
        do {
          if ((byte)(*(char *)(local_188._0_8_ + (long)pcVar21) + 0x9fU) < 0x1a) {
            *(char *)(local_188._0_8_ + (long)pcVar21) =
                 *(char *)(local_188._0_8_ + (long)pcVar21) + -0x20;
          }
          pcVar21 = pcVar21 + 1;
        } while ((char *)local_188._8_8_ != pcVar21);
      }
      Formatter::operator()(&local_108,"case $1$_NOT_SET: {\n  break;\n}\n",(string *)local_188);
      if ((Printer *)local_188._0_8_ != (Printer *)local_178) {
        operator_delete((void *)local_188._0_8_);
      }
      io::Printer::Outdent(local_108.printer_);
      Formatter::operator()<>(&local_108,"}\n");
      local_150._M_dataplus._M_p._0_4_ = (int)local_150._M_dataplus._M_p + 1;
    }
    if (local_1a8->num_weak_fields_ != 0) {
      Formatter::operator()<>(&local_108,"_weak_field_map_.MergeFrom(from._weak_field_map_);\n");
    }
    if (0 < *(int *)(local_1a8->descriptor_ + 0x78)) {
      Formatter::operator()<>
                (&local_108,
                 "_extensions_.MergeFrom(internal_default_instance(), from._extensions_);\n");
    }
    Formatter::operator()<>
              (&local_108,
               "_internal_metadata_.MergeFrom<$unknown_fields_type$>(from._internal_metadata_);\n");
    io::Printer::Outdent(local_108.printer_);
    Formatter::operator()<>(&local_108,"}\n");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_88.variables_._M_t);
    std::
    vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
    ::~vector(&local_128);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_108.vars_._M_t);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateClassSpecificMergeFrom(io::Printer* printer) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  // Generate the class-specific MergeFrom, which avoids the GOOGLE_CHECK and cast.
  Formatter format(printer, variables_);
  format(
      "void $classname$::MergeFrom(const $classname$& from) {\n"
      "$annotate_mergefrom$"
      "// @@protoc_insertion_point(class_specific_merge_from_start:"
      "$full_name$)\n"
      "  $DCHK$_NE(&from, this);\n");
  format.Indent();

  format(
      "$uint32$ cached_has_bits = 0;\n"
      "(void) cached_has_bits;\n\n");

  std::vector<std::vector<const FieldDescriptor*>> chunks = CollectFields(
      optimized_order_,
      [&](const FieldDescriptor* a, const FieldDescriptor* b) -> bool {
        return HasByteIndex(a) == HasByteIndex(b);
      });

  ColdChunkSkipper cold_skipper(options_, chunks, has_bit_indices_, kColdRatio);

  // cached_has_word_index maintains that:
  //   cached_has_bits = from._has_bits_[cached_has_word_index]
  // for cached_has_word_index >= 0
  int cached_has_word_index = -1;

  for (int chunk_index = 0; chunk_index < chunks.size(); chunk_index++) {
    const std::vector<const FieldDescriptor*>& chunk = chunks[chunk_index];
    bool have_outer_if =
        chunk.size() > 1 && HasByteIndex(chunk.front()) != kNoHasbit;
    cold_skipper.OnStartChunk(chunk_index, cached_has_word_index, "from.",
                              printer);

    if (have_outer_if) {
      // Emit an if() that will let us skip the whole chunk if none are set.
      uint32_t chunk_mask = GenChunkMask(chunk, has_bit_indices_);
      std::string chunk_mask_str =
          StrCat(strings::Hex(chunk_mask, strings::ZERO_PAD_8));

      // Check (up to) 8 has_bits at a time if we have more than one field in
      // this chunk.  Due to field layout ordering, we may check
      // _has_bits_[last_chunk * 8 / 32] multiple times.
      GOOGLE_DCHECK_LE(2, popcnt(chunk_mask));
      GOOGLE_DCHECK_GE(8, popcnt(chunk_mask));

      if (cached_has_word_index != HasWordIndex(chunk.front())) {
        cached_has_word_index = HasWordIndex(chunk.front());
        format("cached_has_bits = from._has_bits_[$1$];\n",
               cached_has_word_index);
      }

      format("if (cached_has_bits & 0x$1$u) {\n", chunk_mask_str);
      format.Indent();
    }

    // Go back and emit merging code for each of the fields we processed.
    bool deferred_has_bit_changes = false;
    for (const auto field : chunk) {
      const FieldGenerator& generator = field_generators_.get(field);

      if (field->is_repeated()) {
        generator.GenerateMergingCode(printer);
      } else if (field->is_optional() && !HasHasbit(field)) {
        // Merge semantics without true field presence: primitive fields are
        // merged only if non-zero (numeric) or non-empty (string).
        bool have_enclosing_if =
            EmitFieldNonDefaultCondition(printer, "from.", field);
        generator.GenerateMergingCode(printer);
        if (have_enclosing_if) {
          format.Outdent();
          format("}\n");
        }
      } else if (field->options().weak() ||
                 cached_has_word_index != HasWordIndex(field)) {
        // Check hasbit, not using cached bits.
        GOOGLE_CHECK(HasHasbit(field));
        format("if (from._internal_has_$1$()) {\n", FieldName(field));
        format.Indent();
        generator.GenerateMergingCode(printer);
        format.Outdent();
        format("}\n");
      } else {
        // Check hasbit, using cached bits.
        GOOGLE_CHECK(HasHasbit(field));
        int has_bit_index = has_bit_indices_[field->index()];
        const std::string mask = StrCat(
            strings::Hex(1u << (has_bit_index % 32), strings::ZERO_PAD_8));
        format("if (cached_has_bits & 0x$1$u) {\n", mask);
        format.Indent();

        if (have_outer_if && IsPOD(field)) {
          // Defer hasbit modification until the end of chunk.
          // This can reduce the number of loads/stores by up to 7 per 8 fields.
          deferred_has_bit_changes = true;
          generator.GenerateCopyConstructorCode(printer);
        } else {
          generator.GenerateMergingCode(printer);
        }

        format.Outdent();
        format("}\n");
      }
    }

    if (have_outer_if) {
      if (deferred_has_bit_changes) {
        // Flush the has bits for the primitives we deferred.
        GOOGLE_CHECK_LE(0, cached_has_word_index);
        format("_has_bits_[$1$] |= cached_has_bits;\n", cached_has_word_index);
      }

      format.Outdent();
      format("}\n");
    }

    if (cold_skipper.OnEndChunk(chunk_index, printer)) {
      // Reset here as it may have been updated in just closed if statement.
      cached_has_word_index = -1;
    }
  }

  // Merge oneof fields. Oneof field requires oneof case check.
  for (auto oneof : OneOfRange(descriptor_)) {
    format("switch (from.$1$_case()) {\n", oneof->name());
    format.Indent();
    for (auto field : FieldRange(oneof)) {
      format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
      format.Indent();
      if (!IsFieldStripped(field, options_)) {
        field_generators_.get(field).GenerateMergingCode(printer);
      }
      format("break;\n");
      format.Outdent();
      format("}\n");
    }
    format(
        "case $1$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        ToUpper(oneof->name()));
    format.Outdent();
    format("}\n");
  }
  if (num_weak_fields_) {
    format("_weak_field_map_.MergeFrom(from._weak_field_map_);\n");
  }

  // Merging of extensions and unknown fields is done last, to maximize
  // the opportunity for tail calls.
  if (descriptor_->extension_range_count() > 0) {
    format(
        "_extensions_.MergeFrom(internal_default_instance(), "
        "from._extensions_);\n");
  }

  format(
      "_internal_metadata_.MergeFrom<$unknown_fields_type$>(from._internal_"
      "metadata_);\n");

  format.Outdent();
  format("}\n");
}